

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O0

void state_M4X4(Context *ctx)

{
  int iVar1;
  DestArgInfo *info;
  Context *ctx_local;
  
  iVar1 = writemask_xyzw((ctx->dest_arg).writemask);
  if (iVar1 == 0) {
    fail(ctx,"M4X4 writemask must be full");
  }
  srcarg_matrix_replicate(ctx,1,4);
  return;
}

Assistant:

static void state_M4X4(Context *ctx)
{
    const DestArgInfo *info = &ctx->dest_arg;
    if (!writemask_xyzw(info->writemask))
        fail(ctx, "M4X4 writemask must be full");

// !!! FIXME: MSDN:
//The xyzw (default) mask is required for the destination register. Negate and swizzle modifiers are allowed for src0, but not for src1.
//Swizzle and negate modifiers are invalid for the src0 register. The dest and src0 registers cannot be the same.

    srcarg_matrix_replicate(ctx, 1, 4);
}